

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int __thiscall fmt::v7::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint *__s;
  uint uVar4;
  ulong uVar5;
  
  if (this == divisor) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x2e7,"");
  }
  iVar1 = compare(this,divisor);
  if (iVar1 < 0) {
    iVar1 = 0;
  }
  else {
    if ((divisor->bigits_).super_buffer<unsigned_int>.ptr_
        [(divisor->bigits_).super_buffer<unsigned_int>.size_ - 1] == 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                  ,0x2ea,"");
    }
    uVar4 = this->exp_ - divisor->exp_;
    if (uVar4 != 0 && divisor->exp_ <= this->exp_) {
      iVar1 = (int)(this->bigits_).super_buffer<unsigned_int>.size_;
      if ((int)(uVar4 + iVar1) < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                    ,0x13c,"negative value");
      }
      uVar5 = (ulong)(uVar4 + iVar1);
      uVar3 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
      if (uVar3 < uVar5) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
        uVar3 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
      }
      if (uVar3 < uVar5) {
        uVar5 = uVar3;
      }
      (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
      if (iVar1 < 1) {
        __s = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      }
      else {
        __s = (this->bigits_).super_buffer<unsigned_int>.ptr_;
        uVar3 = 0;
        do {
          __s[(long)(int)(uVar4 + iVar1 + -1) + uVar3] = __s[(iVar1 - 1) + uVar3];
          uVar3 = uVar3 - 1;
        } while (~(ulong)(iVar1 - 1) != uVar3);
      }
      memset(__s,0,(ulong)uVar4 << 2);
      this->exp_ = this->exp_ - uVar4;
    }
    iVar1 = 0;
    do {
      subtract_aligned(this,divisor);
      iVar1 = iVar1 + 1;
      iVar2 = compare(this,divisor);
    } while (-1 < iVar2);
  }
  return iVar1;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }